

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::ConditionalExpression>
          (SequenceMethodExprVisitor *this,ConditionalExpression *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  DiagCode unaff_retaddr;
  bool in_stack_00000017;
  Expression *in_stack_00000018;
  Symbol *sym;
  Diagnostic *this_00;
  Symbol *in_stack_ffffffffffffffe8;
  SourceLocation SVar2;
  
  if ((*(int *)in_RSI != 8) ||
     (SVar2 = in_RDI,
     in_stack_ffffffffffffffe8 = Expression::getSymbolReference(in_stack_00000018,in_stack_00000017)
     , in_stack_ffffffffffffffe8 == (Symbol *)0x0)) goto LAB_00964a5c;
  if (in_stack_ffffffffffffffe8->kind != LocalAssertionVar) {
    if (in_stack_ffffffffffffffe8->kind != AssertionPort) goto LAB_00964a5c;
    Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x9649ff);
    bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x964a07);
    if (!bVar1) goto LAB_00964a5c;
  }
  this_00 = *(Diagnostic **)((long)in_RSI + 0x20);
  sourceRange.endLoc = SVar2;
  sourceRange.startLoc = in_RSI;
  ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffffe8,unaff_retaddr,sourceRange);
  Diagnostic::operator<<(this_00,(string *)in_RDI);
LAB_00964a5c:
  ConditionalExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
            ((ConditionalExpression *)in_RSI,(SequenceMethodExprVisitor *)in_stack_ffffffffffffffe8)
  ;
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (HasVisitExprs<T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }